

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.c
# Opt level: O0

qcc_generator_ptr qcc_gen_one_of(qcc_context *ctx,...)

{
  char in_AL;
  qcc_generator_ptr pqVar1;
  void *pvVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  long *local_110;
  undefined1 local_f8 [8];
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  long local_40;
  qcc_generator_ptr gen;
  va_list args;
  qcc_generator_one_of *res;
  qcc_context *ctx_local;
  
  if (in_AL != '\0') {
    local_c8 = in_XMM0_Qa;
    local_b8 = in_XMM1_Qa;
    local_a8 = in_XMM2_Qa;
    local_98 = in_XMM3_Qa;
    local_88 = in_XMM4_Qa;
    local_78 = in_XMM5_Qa;
    local_68 = in_XMM6_Qa;
    local_58 = in_XMM7_Qa;
  }
  local_f0 = in_RSI;
  local_e8 = in_RDX;
  local_e0 = in_RCX;
  local_d8 = in_R8;
  local_d0 = in_R9;
  pqVar1 = (qcc_generator_ptr)qcc_arena_alloc(ctx->arena,0x28);
  pqVar1->context = ctx;
  pqVar1->type_size = 0;
  pqVar1->generate = qcc_generate_one_of;
  *(undefined4 *)&pqVar1[1].context = 0;
  args[0].overflow_arg_area = local_f8;
  args[0]._0_8_ = &stack0x00000008;
  gen._4_4_ = 0x30;
  gen._0_4_ = 8;
  qcc_arena_begin_array(ctx->arena);
  while( true ) {
    if ((uint)gen < 0x29) {
      local_110 = (long *)((long)(int)(uint)gen + (long)args[0].overflow_arg_area);
      gen._0_4_ = (uint)gen + 8;
    }
    else {
      local_110 = (long *)args[0]._0_8_;
      args[0]._0_8_ = args[0]._0_8_ + 8;
    }
    local_40 = *local_110;
    if (local_40 == 0) break;
    if (pqVar1->type_size == 0) {
      pqVar1->type_size = *(size_t *)(local_40 + 8);
    }
    else if (pqVar1->type_size != *(size_t *)(local_40 + 8)) {
      __assert_fail("res->base.type_size == gen->type_size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/skhoroshavin[P]qcc/src/generator.c"
                    ,0x5a,"qcc_generator_ptr qcc_gen_one_of(struct qcc_context *, ...)");
    }
    *(int *)&pqVar1[1].context = *(int *)&pqVar1[1].context + 1;
    qcc_arena_append_array(ctx->arena,&local_40,8);
  }
  pvVar2 = qcc_arena_end_array(ctx->arena);
  pqVar1[1].type_size = (size_t)pvVar2;
  return pqVar1;
}

Assistant:

qcc_generator_ptr qcc_gen_one_of(struct qcc_context *ctx, ...)
{
    QCC_ARENA_POD(ctx->arena, qcc_generator_one_of, res);
    res->base.context = ctx;
    res->base.type_size = 0;
    res->base.generate = qcc_generate_one_of;
    res->generator_count = 0;

    va_list args;
    va_start(args, ctx);
    qcc_arena_begin_array(ctx->arena);
    while (1)
    {
        qcc_generator_ptr gen = va_arg(args, qcc_generator_ptr);
        if (!gen) break;

        if (res->base.type_size)
            assert(res->base.type_size == gen->type_size);
        else
            res->base.type_size = gen->type_size;

        ++res->generator_count;
        qcc_arena_append_array(ctx->arena, &gen, sizeof(gen));
    }
    va_end(args);
    res->generators = (qcc_generator_ptr *)qcc_arena_end_array(ctx->arena);

    return &res->base;
}